

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O3

Aig_Man_t * Aig_ManDupOrpos(Aig_Man_t *p,int fAddRegs)

{
  char *pcVar1;
  void *pvVar2;
  int iVar3;
  Aig_Man_t *p_00;
  size_t sVar4;
  char *pcVar5;
  Aig_Obj_t *pAVar6;
  ulong uVar7;
  Vec_Ptr_t *pVVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  Aig_Obj_t *pAVar12;
  uint uVar13;
  long lVar14;
  
  if (p->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDup.c"
                  ,0x450,"Aig_Man_t *Aig_ManDupOrpos(Aig_Man_t *, int)");
  }
  if (p->nConstrs < 1) {
    p_00 = Aig_ManStart(p->vObjs->nSize);
    pcVar1 = p->pName;
    if (pcVar1 == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      sVar4 = strlen(pcVar1);
      pcVar5 = (char *)malloc(sVar4 + 1);
      strcpy(pcVar5,pcVar1);
    }
    p_00->pName = pcVar5;
    pcVar1 = p->pSpec;
    if (pcVar1 == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      sVar4 = strlen(pcVar1);
      pcVar5 = (char *)malloc(sVar4 + 1);
      strcpy(pcVar5,pcVar1);
    }
    p_00->pSpec = pcVar5;
    Aig_ManCleanData(p);
    p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
    pVVar8 = p->vCis;
    if (0 < pVVar8->nSize) {
      lVar14 = 0;
      do {
        pvVar2 = pVVar8->pArray[lVar14];
        pAVar6 = Aig_ObjCreateCi(p_00);
        *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar6;
        lVar14 = lVar14 + 1;
        pVVar8 = p->vCis;
      } while (lVar14 < pVVar8->nSize);
    }
    if (fAddRegs == 0) {
      p_00->nRegs = 0;
      iVar10 = p->nRegs;
      iVar3 = p->nTruePis + iVar10;
    }
    else {
      iVar10 = p->nRegs;
      p_00->nRegs = iVar10;
      iVar3 = p->nTruePis;
    }
    p_00->nTruePis = iVar3;
    p_00->nTruePos = 1;
    pVVar8 = p->vObjs;
    if (0 < pVVar8->nSize) {
      lVar14 = 0;
      do {
        pvVar2 = pVVar8->pArray[lVar14];
        if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
          if (((ulong)pvVar2 & 1) != 0) goto LAB_006c3e64;
          uVar7 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
          if (uVar7 == 0) {
            pAVar6 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar6 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar7 + 0x28));
          }
          uVar7 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
          if (uVar7 == 0) {
            pAVar12 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar12 = (Aig_Obj_t *)
                      ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^ *(ulong *)(uVar7 + 0x28)
                      );
          }
          pAVar6 = Aig_And(p_00,pAVar6,pAVar12);
          *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar6;
          pVVar8 = p->vObjs;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < pVVar8->nSize);
      iVar10 = p->nRegs;
    }
    pAVar6 = (Aig_Obj_t *)((ulong)p_00->pConst1 ^ 1);
    if (iVar10 < p->nObjs[3]) {
      lVar14 = 0;
      do {
        if (p->vCos->nSize <= lVar14) goto LAB_006c3e83;
        pvVar2 = p->vCos->pArray[lVar14];
        if (((ulong)pvVar2 & 1) != 0) goto LAB_006c3e64;
        uVar7 = *(ulong *)((long)pvVar2 + 8);
        uVar11 = uVar7 & 0xfffffffffffffffe;
        if (uVar11 == 0) {
          pAVar12 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar12 = (Aig_Obj_t *)((ulong)((uint)uVar7 & 1) ^ *(ulong *)(uVar11 + 0x28));
        }
        pAVar6 = Aig_Or(p_00,pAVar6,pAVar12);
        lVar14 = lVar14 + 1;
      } while (lVar14 < (long)p->nObjs[3] - (long)p->nRegs);
    }
    Aig_ObjCreateCo(p_00,pAVar6);
    if (fAddRegs != 0) {
      uVar13 = p->nObjs[3] - p->nRegs;
      pVVar8 = p->vCos;
      if ((int)uVar13 < pVVar8->nSize) {
        uVar7 = (ulong)uVar13;
        do {
          if ((int)uVar13 < 0) {
LAB_006c3e83:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          if (((ulong)pVVar8->pArray[uVar7] & 1) != 0) {
LAB_006c3e64:
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                          ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
          }
          uVar11 = *(ulong *)((long)pVVar8->pArray[uVar7] + 8);
          uVar9 = uVar11 & 0xfffffffffffffffe;
          if (uVar9 == 0) {
            pAVar6 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar6 = (Aig_Obj_t *)((ulong)((uint)uVar11 & 1) ^ *(ulong *)(uVar9 + 0x28));
          }
          Aig_ObjCreateCo(p_00,pAVar6);
          uVar7 = uVar7 + 1;
          pVVar8 = p->vCos;
        } while ((int)uVar7 < pVVar8->nSize);
      }
    }
    Aig_ManCleanup(p_00);
  }
  else {
    puts("The AIG manager should have no constraints.");
    p_00 = (Aig_Man_t *)0x0;
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManDupOrpos( Aig_Man_t * p, int fAddRegs )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pMiter;
    int i;
    assert( Aig_ManRegNum(p) > 0 );
    if ( p->nConstrs > 0 )
    {
        printf( "The AIG manager should have no constraints.\n" );
        return NULL;
    }
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // set registers
    pNew->nRegs    = fAddRegs? p->nRegs : 0;
    pNew->nTruePis = fAddRegs? p->nTruePis : p->nTruePis + p->nRegs;
    pNew->nTruePos = 1;
    // duplicate internal nodes
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create the PO
    pMiter = Aig_ManConst0(pNew);
    Aig_ManForEachPoSeq( p, pObj, i )
        pMiter = Aig_Or( pNew, pMiter, Aig_ObjChild0Copy(pObj) ); 
    Aig_ObjCreateCo( pNew, pMiter );
    // create register inputs with MUXes
    if ( fAddRegs )
    {
        Aig_ManForEachLiSeq( p, pObj, i )
            Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    Aig_ManCleanup( pNew );
    return pNew;
}